

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

string * __thiscall
compiler::AssemblerCompiler::do_conditional_abi_cxx11_
          (string *__return_storage_ptr__,AssemblerCompiler *this,Conditional *conditional)

{
  string local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  string local_2a0;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string local_240;
  undefined1 local_210 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  size_t local_30;
  size_t label_false;
  size_t label_true;
  Conditional *conditional_local;
  AssemblerCompiler *this_local;
  
  label_false = this->label_counter_;
  this->label_counter_ = label_false + 1;
  local_30 = this->label_counter_;
  this->label_counter_ = local_30 + 1;
  label_true = (size_t)conditional;
  conditional_local = (Conditional *)this;
  this_local = (AssemblerCompiler *)__return_storage_ptr__;
  Var::accept_abi_cxx11_
            ((Var *)local_210,(int)conditional->expression,(sockaddr *)this,
             (socklen_t *)(local_30 + 1));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_210 + 0x20),"GOTOIF ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210);
  std::operator+(&local_1d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_210 + 0x20),", ");
  std::__cxx11::to_string(&local_240,label_false);
  std::operator+(&local_1b0,&local_1d0,&local_240);
  std::operator+(&local_190,&local_1b0,";");
  (**(code **)**(undefined8 **)(label_true + 0x18))
            (&local_260,*(undefined8 **)(label_true + 0x18),this);
  std::operator+(&local_170,&local_190,&local_260);
  std::operator+(&local_150,&local_170,"GOTOIF 1, ");
  std::__cxx11::to_string(&local_280,local_30);
  std::operator+(&local_130,&local_150,&local_280);
  std::operator+(&local_110,&local_130,";");
  std::operator+(&local_f0,&local_110,"LABEL ");
  std::__cxx11::to_string(&local_2a0,label_false);
  std::operator+(&local_d0,&local_f0,&local_2a0);
  std::operator+(&local_b0,&local_d0,";");
  (**(code **)**(undefined8 **)(label_true + 0x10))
            (&local_2c0,*(undefined8 **)(label_true + 0x10),this);
  std::operator+(&local_90,&local_b0,&local_2c0);
  std::operator+(&local_70,&local_90,"LABEL ");
  std::__cxx11::to_string(&local_2e0,local_30);
  std::operator+(&local_50,&local_70,&local_2e0);
  std::operator+(__return_storage_ptr__,&local_50,";");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)(local_210 + 0x20));
  std::__cxx11::string::~string((string *)local_210);
  return __return_storage_ptr__;
}

Assistant:

std::string AssemblerCompiler::do_conditional(const Conditional *conditional) {
    auto label_true = label_counter_++;
    auto label_false = label_counter_++;

    return "GOTOIF " + conditional->expression->accept(this) + ", " + std::to_string(label_true) + ";" +
           conditional->right->accept(this) +
           "GOTOIF 1, " + std::to_string(label_false) + ";" +
           "LABEL " + std::to_string(label_true) + ";" +
           conditional->left->accept(this) +
           "LABEL " + std::to_string(label_false) + ";";
}